

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void google::protobuf::internal::RepeatedPrimitiveGenericTypeTraits::DestroyDefaultRepeatedFields
               (void)

{
  long *plVar1;
  RepeatedField<int> *pRVar2;
  RepeatedField<long> *pRVar3;
  RepeatedField<unsigned_int> *pRVar4;
  RepeatedField<unsigned_long> *pRVar5;
  RepeatedField<double> *pRVar6;
  RepeatedField<float> *pRVar7;
  void *pvVar8;
  
  pRVar2 = default_repeated_field_int32_;
  if (default_repeated_field_int32_ != (RepeatedField<int> *)0x0) {
    RepeatedField<int>::~RepeatedField(default_repeated_field_int32_);
  }
  operator_delete(pRVar2,0x10);
  pRVar3 = default_repeated_field_int64_;
  if (default_repeated_field_int64_ != (RepeatedField<long> *)0x0) {
    RepeatedField<long>::~RepeatedField(default_repeated_field_int64_);
  }
  operator_delete(pRVar3,0x10);
  pRVar4 = default_repeated_field_uint32_;
  if (default_repeated_field_uint32_ != (RepeatedField<unsigned_int> *)0x0) {
    RepeatedField<unsigned_int>::~RepeatedField(default_repeated_field_uint32_);
  }
  operator_delete(pRVar4,0x10);
  pRVar5 = default_repeated_field_uint64_;
  if (default_repeated_field_uint64_ != (RepeatedField<unsigned_long> *)0x0) {
    RepeatedField<unsigned_long>::~RepeatedField(default_repeated_field_uint64_);
  }
  operator_delete(pRVar5,0x10);
  pRVar6 = default_repeated_field_double_;
  if (default_repeated_field_double_ != (RepeatedField<double> *)0x0) {
    RepeatedField<double>::~RepeatedField(default_repeated_field_double_);
  }
  operator_delete(pRVar6,0x10);
  pRVar7 = default_repeated_field_float_;
  if (default_repeated_field_float_ != (RepeatedField<float> *)0x0) {
    RepeatedField<float>::~RepeatedField(default_repeated_field_float_);
  }
  operator_delete(pRVar7,0x10);
  pvVar8 = default_repeated_field_bool_;
  if (((default_repeated_field_bool_ != (void *)0x0) &&
      (plVar1 = *(long **)((long)default_repeated_field_bool_ + 8), plVar1 != (long *)0x0)) &&
     (*plVar1 == 0)) {
    operator_delete(plVar1,(long)*(int *)((long)default_repeated_field_bool_ + 4) + 8);
  }
  operator_delete(pvVar8,0x10);
  return;
}

Assistant:

void RepeatedPrimitiveGenericTypeTraits::DestroyDefaultRepeatedFields() {
  delete default_repeated_field_int32_;
  delete default_repeated_field_int64_;
  delete default_repeated_field_uint32_;
  delete default_repeated_field_uint64_;
  delete default_repeated_field_double_;
  delete default_repeated_field_float_;
  delete default_repeated_field_bool_;
}